

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O3

void __thiscall icu_63::RBBITableBuilder::flagTaggedStates(RBBITableBuilder *this)

{
  int32_t iVar1;
  void *obj;
  void *pvVar2;
  int index;
  UVector *this_00;
  int32_t index_00;
  UVector tagNodes;
  UVector UStack_58;
  
  if (*this->fStatus < U_ILLEGAL_ARGUMENT_ERROR) {
    UVector::UVector(&UStack_58,this->fStatus);
    if (*this->fStatus < U_ILLEGAL_ARGUMENT_ERROR) {
      RBBINode::findNodes(*this->fTree,&UStack_58,tag,this->fStatus);
      if ((*this->fStatus < U_ILLEGAL_ARGUMENT_ERROR) && (0 < UStack_58.count)) {
        index = 0;
        do {
          obj = UVector::elementAt(&UStack_58,index);
          this_00 = this->fDStates;
          if (0 < this_00->count) {
            index_00 = 0;
            do {
              pvVar2 = UVector::elementAt(this_00,index_00);
              iVar1 = UVector::indexOf(*(UVector **)((long)pvVar2 + 0x20),obj,0);
              if (-1 < iVar1) {
                sortedAdd(this,(UVector **)((long)pvVar2 + 0x10),*(int32_t *)((long)obj + 0x7c));
              }
              index_00 = index_00 + 1;
              this_00 = this->fDStates;
            } while (index_00 < this_00->count);
          }
          index = index + 1;
        } while (index < UStack_58.count);
      }
    }
    UVector::~UVector(&UStack_58);
  }
  return;
}

Assistant:

void     RBBITableBuilder::flagTaggedStates() {
    if (U_FAILURE(*fStatus)) {
        return;
    }
    UVector     tagNodes(*fStatus);
    RBBINode    *tagNode;
    int32_t     i;
    int32_t     n;

    if (U_FAILURE(*fStatus)) {
        return;
    }
    fTree->findNodes(&tagNodes, RBBINode::tag, *fStatus);
    if (U_FAILURE(*fStatus)) {
        return;
    }
    for (i=0; i<tagNodes.size(); i++) {                   // For each tag node t (all of 'em)
        tagNode = (RBBINode *)tagNodes.elementAt(i);

        for (n=0; n<fDStates->size(); n++) {              //    For each state  s (row in the state table)
            RBBIStateDescriptor *sd = (RBBIStateDescriptor *)fDStates->elementAt(n);
            if (sd->fPositions->indexOf(tagNode) >= 0) {  //       if  s include the tag node t
                sortedAdd(&sd->fTagVals, tagNode->fVal);
            }
        }
    }
}